

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O2

xmlParserInputBufferPtr xmlParserInputBufferCreateFile(FILE *file,xmlCharEncoding enc)

{
  xmlParserInputBufferPtr pxVar1;
  
  if (xmlInputCallbackInitialized == '\0') {
    xmlRegisterDefaultInputCallbacks();
  }
  if ((file != (FILE *)0x0) &&
     (pxVar1 = xmlAllocParserInputBuffer(enc), pxVar1 != (xmlParserInputBufferPtr)0x0)) {
    pxVar1->context = file;
    pxVar1->readcallback = xmlFileRead;
    pxVar1->closecallback = xmlFileFlush;
    return pxVar1;
  }
  return (xmlParserInputBufferPtr)0x0;
}

Assistant:

xmlParserInputBufferPtr
xmlParserInputBufferCreateFile(FILE *file, xmlCharEncoding enc) {
    xmlParserInputBufferPtr ret;

    if (xmlInputCallbackInitialized == 0)
	xmlRegisterDefaultInputCallbacks();

    if (file == NULL) return(NULL);

    ret = xmlAllocParserInputBuffer(enc);
    if (ret != NULL) {
        ret->context = file;
	ret->readcallback = xmlFileRead;
	ret->closecallback = xmlFileFlush;
    }

    return(ret);
}